

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

uv_os_sock_t create_tcp_socket(void)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  undefined8 uStack_20;
  int yes;
  
  __fd = socket(2,1,0);
  if (__fd < 0) {
    pcVar2 = "sock >= 0";
    uStack_20 = 0x3d;
  }
  else {
    yes = 1;
    iVar1 = setsockopt(__fd,1,2,&yes,4);
    if (iVar1 == 0) {
      return __fd;
    }
    pcVar2 = "r == 0";
    uStack_20 = 0x45;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
          ,uStack_20,pcVar2);
  abort();
}

Assistant:

static uv_os_sock_t create_tcp_socket(void) {
  uv_os_sock_t sock;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT(sock != INVALID_SOCKET);
#else
  ASSERT(sock >= 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    int r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT(r == 0);
  }
#endif

  return sock;
}